

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

float __thiscall
glu::TextureTestUtil::computeNonProjectedTriLod
          (TextureTestUtil *this,LodMode mode,IVec2 *dstSize,IVec3 *srcSize,Vec3 *sq,Vec3 *tq,
          Vec3 *rq)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (float)(int)mode;
  fVar2 = (float)(int)dstSize;
  fVar1 = computeLodFromDerivates
                    ((LodMode)this,
                     ((sq->m_data[2] - sq->m_data[0]) * (float)srcSize->m_data[0]) / fVar1,
                     ((tq->m_data[2] - tq->m_data[0]) * (float)srcSize->m_data[1]) / fVar1,
                     ((rq->m_data[2] - rq->m_data[0]) * (float)srcSize->m_data[2]) / fVar1,
                     ((sq->m_data[1] - sq->m_data[0]) * (float)srcSize->m_data[0]) / fVar2,
                     ((tq->m_data[1] - tq->m_data[0]) * (float)srcSize->m_data[1]) / fVar2,
                     ((rq->m_data[1] - rq->m_data[0]) * (float)srcSize->m_data[2]) / fVar2);
  return fVar1;
}

Assistant:

static float computeNonProjectedTriLod (LodMode mode, const tcu::IVec2& dstSize, const tcu::IVec3& srcSize, const tcu::Vec3& sq, const tcu::Vec3& tq, const tcu::Vec3& rq)
{
	float dux	= (sq.z() - sq.x()) * (float)srcSize.x();
	float duy	= (sq.y() - sq.x()) * (float)srcSize.x();
	float dvx	= (tq.z() - tq.x()) * (float)srcSize.y();
	float dvy	= (tq.y() - tq.x()) * (float)srcSize.y();
	float dwx	= (rq.z() - rq.x()) * (float)srcSize.z();
	float dwy	= (rq.y() - rq.x()) * (float)srcSize.z();
	float dx	= (float)dstSize.x();
	float dy	= (float)dstSize.y();

	return computeLodFromDerivates(mode, dux/dx, dvx/dx, dwx/dx, duy/dy, dvy/dy, dwy/dy);
}